

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

int GetBits(uint8_t *data,size_t data_size,size_t nb,int *val,uint64_t *bit_pos)

{
  ulong uVar1;
  int bit;
  uint64_t p;
  uint64_t *bit_pos_local;
  int *val_local;
  size_t nb_local;
  size_t data_size_local;
  uint8_t *data_local;
  
  *val = 0;
  nb_local = nb;
  while( true ) {
    if (nb_local == 0) {
      return 1;
    }
    uVar1 = *bit_pos;
    *bit_pos = uVar1 + 1;
    if (data_size <= uVar1 >> 3) break;
    *val = *val << 1 | (uint)(((uint)data[uVar1 >> 3] & 0x80 >> ((byte)uVar1 & 7)) != 0);
    nb_local = nb_local - 1;
  }
  return 0;
}

Assistant:

static int GetBits(const uint8_t* const data, size_t data_size, size_t nb,
                   int* val, uint64_t* const bit_pos) {
  *val = 0;
  while (nb-- > 0) {
    const uint64_t p = (*bit_pos)++;
    if ((p >> 3) >= data_size) {
      return 0;
    } else {
      const int bit = !!(data[p >> 3] & (128 >> ((p & 7))));
      *val = (*val << 1) | bit;
    }
  }
  return 1;
}